

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

void __thiscall TCPListener::start(TCPListener *this,Address address,int backlogLength)

{
  int iVar1;
  int *piVar2;
  TCPListenerError *pTVar3;
  allocator local_d5;
  int enable;
  Address address_local;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  address_local.sin_zero = address.sin_zero;
  address_local._0_8_ = address._0_8_;
  if (backlogLength < 1) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_40,"TCPListener\'s queue cannot be shorter than 1",
               (allocator *)&enable);
    TCPListenerError::TCPListenerError(pTVar3,&local_40,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  this->backlogLength = backlogLength;
  if (this->listening != false) {
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_c0,"TCPListener is already listening",(allocator *)&enable);
    TCPListenerError::TCPListenerError(pTVar3,&local_c0,0);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = bind((this->super_Socket).socketDescriptor,(sockaddr *)&address_local,0x10);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_60,"Could not bind",(allocator *)&enable);
    TCPListenerError::TCPListenerError(pTVar3,&local_60,iVar1);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  enable = 1;
  iVar1 = setsockopt((this->super_Socket).socketDescriptor,1,2,&enable,4);
  if (-1 < iVar1) {
    iVar1 = listen((this->super_Socket).socketDescriptor,backlogLength);
    if (-1 < iVar1) {
      this->listening = true;
      return;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_a0,"Could not start listening",&local_d5);
    TCPListenerError::TCPListenerError(pTVar3,&local_a0,iVar1);
    __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  pTVar3 = (TCPListenerError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_80,"Could not setup address reusing for TCPListener",&local_d5);
  TCPListenerError::TCPListenerError(pTVar3,&local_80,iVar1);
  __cxa_throw(pTVar3,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
}

Assistant:

void TCPListener::start(Address address, int backlogLength)
{
    if(backlogLength < 1){
        throw TCPListenerError("TCPListener's queue cannot be shorter than 1");
    }
    this->backlogLength = backlogLength;

    if(!listening)
    {
        if(::bind(socketDescriptor, (sockaddr*)&address, sizeof(address)) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not bind", x);
        }

        int enable = 1;
        int status = setsockopt(socketDescriptor, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int));
        if (status < 0){
            int x = errno;
            throw TCPListenerError("Could not setup address reusing for TCPListener", x);
        }

        if(::listen(socketDescriptor, backlogLength) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not start listening", x);
        }

        listening = true;
    }
    else
    {
        throw TCPListenerError("TCPListener is already listening");
    }
}